

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O3

void __thiscall QTest::WatchDog::setExpectation(WatchDog *this,Expectation e)

{
  int iVar1;
  Expectation EVar2;
  Expectation EVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar1 == 0) {
    EVar2 = (this->expecting)._M_i & ~ThreadEnd;
    EVar3 = EVar2 + 5;
    if (e != TestFunctionStart) {
      EVar3 = EVar2 | e;
    }
    (this->expecting)._M_i = EVar3;
    std::condition_variable::notify_all();
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void setExpectation(Expectation e)
    {
        Q_ASSERT(generation(e) == 0); // no embedded generation allowed
        const auto locker = qt_scoped_lock(mutex);
        auto cur = expecting.load(std::memory_order_relaxed);
        auto gen = generation(cur);
        if (e == TestFunctionStart)
            ++gen;
        e = combine(e, gen);
        expecting.store(e, std::memory_order_relaxed);
        waitCondition.notify_all();
    }